

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPService.cpp
# Opt level: O0

PTR brynet::net::TcpService::Create(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  PTR PVar1;
  shared_ptr<make_shared_enabler> local_20;
  
  std::make_shared<brynet::net::TcpService::Create()::make_shared_enabler>();
  std::shared_ptr<brynet::net::TcpService>::
  shared_ptr<brynet::net::TcpService::Create()::make_shared_enabler,void>
            ((shared_ptr<brynet::net::TcpService> *)in_RDI,&local_20);
  std::shared_ptr<make_shared_enabler>::~shared_ptr(&local_20);
  PVar1.super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar1.super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (PTR)PVar1.super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TcpService::PTR TcpService::Create()
{
    struct make_shared_enabler : public TcpService {};
    return std::make_shared<make_shared_enabler>();
}